

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead80pq.c
# Opt level: O3

void ascon_aead80pq_encrypt
               (uint8_t *ciphertext,uint8_t *tag,uint8_t *key,uint8_t *nonce,uint8_t *assoc_data,
               uint8_t *plaintext,size_t assoc_data_len,size_t plaintext_len,size_t tag_len)

{
  size_t sVar1;
  ascon_aead_ctx_t aStack_88;
  
  ascon_aead80pq_init(&aStack_88,key,nonce);
  ascon_aead128_assoc_data_update(&aStack_88,assoc_data,assoc_data_len);
  sVar1 = ascon_aead128_encrypt_update(&aStack_88,ciphertext,plaintext,plaintext_len);
  ascon_aead80pq_encrypt_final(&aStack_88,ciphertext + sVar1,tag,tag_len);
  return;
}

Assistant:

ASCON_API void
ascon_aead80pq_encrypt(uint8_t* ciphertext,
                       uint8_t* tag,
                       const uint8_t key[ASCON_AEAD80pq_KEY_LEN],
                       const uint8_t nonce[ASCON_AEAD_NONCE_LEN],
                       const uint8_t* assoc_data,
                       const uint8_t* plaintext,
                       size_t assoc_data_len,
                       size_t plaintext_len,
                       size_t tag_len)
{
    ASCON_ASSERT(plaintext_len == 0 || ciphertext != NULL);
    ASCON_ASSERT(tag_len != 0 || tag != NULL);
    ASCON_ASSERT(key != NULL);
    ASCON_ASSERT(nonce != NULL);
    ASCON_ASSERT(assoc_data_len == 0 || assoc_data != NULL);
    ASCON_ASSERT(plaintext_len == 0 || plaintext != NULL);
    ascon_aead_ctx_t ctx;
    ascon_aead80pq_init(&ctx, key, nonce);
    ascon_aead80pq_assoc_data_update(&ctx, assoc_data, assoc_data_len);
    const size_t new_ct_bytes = ascon_aead80pq_encrypt_update(&ctx, ciphertext,
                                                              plaintext,
                                                              plaintext_len);
    ascon_aead80pq_encrypt_final(&ctx, ciphertext + new_ct_bytes,
                                 tag, tag_len);
}